

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currencies_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::
CurrenciesTest_test_currency_pairs_do_not_validate_as_a_currency_Test::TestBody
          (CurrenciesTest_test_currency_pairs_do_not_validate_as_a_currency_Test *this)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  string local_1e8;
  AssertHelper local_1c8;
  Message local_1c0;
  allocator<char> local_1b1;
  string local_1b0 [39];
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_158;
  Message local_150;
  allocator<char> local_141;
  string local_140 [39];
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_e8;
  Message local_e0;
  allocator<char> local_d1;
  string local_d0 [39];
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  string local_90;
  AssertHelper local_70;
  Message local_68 [3];
  allocator<char> local_49;
  string local_48 [39];
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  CurrenciesTest_test_currency_pairs_do_not_validate_as_a_currency_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"EURGBP",&local_49);
  bVar1 = bidfx_public_api::price::Currencies::IsValidCurrency(local_48);
  local_21 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar2) {
    testing::Message::Message(local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)local_20,
               (AssertionResult *)"Currencies::IsValidCurrency(\"EURGBP\")","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    testing::Message::~Message(local_68);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d0,"EURJPY",&local_d1);
    bVar1 = bidfx_public_api::price::Currencies::IsValidCurrency(local_d0);
    local_a9 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_a8,&local_a9,(type *)0x0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar2) {
      testing::Message::Message(&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_a8,
                 (AssertionResult *)"Currencies::IsValidCurrency(\"EURJPY\")","true","false",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                 ,0x35,pcVar3);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_e0);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_140,"AUDNZD",&local_141);
      bVar1 = bidfx_public_api::price::Currencies::IsValidCurrency(local_140);
      local_119 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_118,&local_119,(type *)0x0);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator(&local_141);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
      if (!bVar2) {
        testing::Message::Message(&local_150);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_118,
                   (AssertionResult *)"Currencies::IsValidCurrency(\"AUDNZD\")","true","false",in_R9
                  );
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                   ,0x36,pcVar3);
        testing::internal::AssertHelper::operator=(&local_158,&local_150);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_150);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_1b0,"USDEUR",&local_1b1);
        bVar1 = bidfx_public_api::price::Currencies::IsValidCurrency(local_1b0);
        local_189 = (bool)(~bVar1 & 1);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_188,&local_189,(type *)0x0);
        std::__cxx11::string::~string(local_1b0);
        std::allocator<char>::~allocator(&local_1b1);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
        if (!bVar2) {
          testing::Message::Message(&local_1c0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_1e8,(internal *)local_188,
                     (AssertionResult *)"Currencies::IsValidCurrency(\"USDEUR\")","true","false",
                     in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                     ,0x37,pcVar3);
          testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
          testing::internal::AssertHelper::~AssertHelper(&local_1c8);
          std::__cxx11::string::~string((string *)&local_1e8);
          testing::Message::~Message(&local_1c0);
        }
        gtest_ar__1.message_.ptr_._5_3_ = 0;
        gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
      }
    }
  }
  return;
}

Assistant:

TEST(CurrenciesTest, test_currency_pairs_do_not_validate_as_a_currency)
{
    ASSERT_FALSE(Currencies::IsValidCurrency("EURGBP"));
    ASSERT_FALSE(Currencies::IsValidCurrency("EURJPY"));
    ASSERT_FALSE(Currencies::IsValidCurrency("AUDNZD"));
    ASSERT_FALSE(Currencies::IsValidCurrency("USDEUR"));
}